

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error internalEntityProcessor(XML_Parser parser,char *s,char *end,char **nextPtr)

{
  OPEN_INTERNAL_ENTITY *pOVar1;
  OPEN_INTERNAL_ENTITY *openEntity;
  char *pcStack_50;
  XML_Error result;
  char *next;
  char *textEnd;
  char *textStart;
  ENTITY *entity;
  char **nextPtr_local;
  char *end_local;
  char *s_local;
  XML_Parser parser_local;
  
  pOVar1 = parser->m_openInternalEntities;
  if (pOVar1 == (OPEN_INTERNAL_ENTITY *)0x0) {
    parser_local._4_4_ = XML_ERROR_UNEXPECTED_STATE;
  }
  else {
    textStart = (char *)pOVar1->entity;
    pcStack_50 = ((ENTITY *)textStart)->textPtr + ((ENTITY *)textStart)->processed;
    next = ((ENTITY *)textStart)->textPtr + ((ENTITY *)textStart)->textLen;
    textEnd = pcStack_50;
    entity = (ENTITY *)nextPtr;
    nextPtr_local = (char **)end;
    end_local = s;
    s_local = (char *)parser;
    parser_local._4_4_ =
         doContent(parser,pOVar1->startTagLevel,parser->m_internalEncoding,pcStack_50,next,
                   &stack0xffffffffffffffb0,'\0',XML_ACCOUNT_ENTITY_EXPANSION);
    if (parser_local._4_4_ == XML_ERROR_NONE) {
      if ((next == pcStack_50) || (*(int *)(s_local + 0x370) != 3)) {
        textStart[0x38] = '\0';
        *(open_internal_entity **)(s_local + 0x220) = pOVar1->next;
        pOVar1->next = *(open_internal_entity **)(s_local + 0x228);
        *(OPEN_INTERNAL_ENTITY **)(s_local + 0x228) = pOVar1;
        *(code **)(s_local + 0x1f8) = contentProcessor;
        parser_local._4_4_ =
             doContent((XML_Parser)s_local,(uint)(*(long *)(s_local + 0x368) != 0),
                       *(ENCODING **)(s_local + 0x120),end_local,(char *)nextPtr_local,&entity->name
                       ,(s_local[0x374] != '\0' ^ 0xffU) & 1,XML_ACCOUNT_DIRECT);
      }
      else {
        *(int *)(textStart + 0x14) = (int)pcStack_50 - (int)*(undefined8 *)(textStart + 8);
      }
    }
  }
  return parser_local._4_4_;
}

Assistant:

static enum XML_Error PTRCALL
internalEntityProcessor(XML_Parser parser, const char *s, const char *end,
                        const char **nextPtr) {
  ENTITY *entity;
  const char *textStart, *textEnd;
  const char *next;
  enum XML_Error result;
  OPEN_INTERNAL_ENTITY *openEntity = parser->m_openInternalEntities;
  if (! openEntity)
    return XML_ERROR_UNEXPECTED_STATE;

  entity = openEntity->entity;
  textStart = ((const char *)entity->textPtr) + entity->processed;
  textEnd = (const char *)(entity->textPtr + entity->textLen);
  /* Set a safe default value in case 'next' does not get set */
  next = textStart;

#ifdef XML_DTD
  if (entity->is_param) {
    int tok
        = XmlPrologTok(parser->m_internalEncoding, textStart, textEnd, &next);
    result = doProlog(parser, parser->m_internalEncoding, textStart, textEnd,
                      tok, next, &next, XML_FALSE, XML_TRUE,
                      XML_ACCOUNT_ENTITY_EXPANSION);
  } else
#endif /* XML_DTD */
    result = doContent(parser, openEntity->startTagLevel,
                       parser->m_internalEncoding, textStart, textEnd, &next,
                       XML_FALSE, XML_ACCOUNT_ENTITY_EXPANSION);

  if (result != XML_ERROR_NONE)
    return result;
  else if (textEnd != next
           && parser->m_parsingStatus.parsing == XML_SUSPENDED) {
    entity->processed = (int)(next - (const char *)entity->textPtr);
    return result;
  } else {
#ifdef XML_DTD
    entityTrackingOnClose(parser, entity, __LINE__);
#endif
    entity->open = XML_FALSE;
    parser->m_openInternalEntities = openEntity->next;
    /* put openEntity back in list of free instances */
    openEntity->next = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity;
  }

#ifdef XML_DTD
  if (entity->is_param) {
    int tok;
    parser->m_processor = prologProcessor;
    tok = XmlPrologTok(parser->m_encoding, s, end, &next);
    return doProlog(parser, parser->m_encoding, s, end, tok, next, nextPtr,
                    (XML_Bool)! parser->m_parsingStatus.finalBuffer, XML_TRUE,
                    XML_ACCOUNT_DIRECT);
  } else
#endif /* XML_DTD */
  {
    parser->m_processor = contentProcessor;
    /* see externalEntityContentProcessor vs contentProcessor */
    return doContent(parser, parser->m_parentParser ? 1 : 0, parser->m_encoding,
                     s, end, nextPtr,
                     (XML_Bool)! parser->m_parsingStatus.finalBuffer,
                     XML_ACCOUNT_DIRECT);
  }
}